

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O2

void bench_get_descriptor
               (vector<void_(*)(integral_image_*,_interest_point_*,_float_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*,_float_*)>_>
                *functions,integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points,float *GW,
               vector<benchmark_data,_std::allocator<benchmark_data>_> *data)

{
  uint uVar1;
  pointer pbVar2;
  reference __src;
  uint uVar3;
  ulong uVar4;
  size_type __n;
  int j;
  ulong uVar5;
  interest_point ipoint;
  
  for (uVar5 = 0; uVar5 < (ulong)(*(long *)(functions + 8) - *(long *)functions >> 3);
      uVar5 = uVar5 + 1) {
    uVar1 = (data->super__Vector_base<benchmark_data,_std::allocator<benchmark_data>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar5].num_interest_points;
    uVar3 = 5;
    if ((int)uVar1 < 5) {
      uVar3 = uVar1;
    }
    for (__n = 0; (~((int)uVar3 >> 0x1f) & uVar3) != __n; __n = __n + 1) {
      __src = std::vector<interest_point,_std::allocator<interest_point>_>::at(interest_points,__n);
      memcpy(&ipoint,__src,0x114);
      perf_get_descriptor(*(_func_void_integral_image_ptr_interest_point_ptr_float_ptr **)
                           (*(long *)functions + uVar5 * 8),iimage,&ipoint,GW,
                          (data->super__Vector_base<benchmark_data,_std::allocator<benchmark_data>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar5);
    }
    if (uVar1 != 0) {
      pbVar2 = (data->super__Vector_base<benchmark_data,_std::allocator<benchmark_data>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = (ulong)(int)uVar3;
      pbVar2[uVar5].avg_cycles = pbVar2[uVar5].avg_cycles / uVar4;
      pbVar2[uVar5].max_cycles = pbVar2[uVar5].max_cycles / uVar4;
      pbVar2[uVar5].min_cycles = pbVar2[uVar5].min_cycles / uVar4;
      pbVar2[uVar5].flops_per_cycle = pbVar2[uVar5].flops_per_cycle / (double)(int)uVar3;
    }
  }
  return;
}

Assistant:

void bench_get_descriptor(
    const std::vector<void (*)(struct integral_image *, struct interest_point *, float *)> &functions,
    struct integral_image *iimage, std::vector<struct interest_point> *interest_points, float *GW,
    std::vector<struct benchmark_data> &data) {
    assert(functions.size() == data.size());

    // Iterating through all functions that should be benchmarked
    for (int j = 0; j < functions.size(); ++j) {
        // Specifies how many times the timing for get_descriptor will be called. The average will be taken.
        int counter = MIN(5, data[j].num_interest_points);
        for (int i = 0; i < counter; ++i) {
            struct interest_point ipoint = interest_points->at(i);
            perf_get_descriptor(functions[j], iimage, &ipoint, GW, data[j]);
        }

        // Take the average of the runs.
        if (counter != 0) {
            data[j].avg_cycles /= counter;
            data[j].max_cycles /= counter;
            data[j].min_cycles /= counter;
            data[j].flops_per_cycle /= counter;
        }
    }
}